

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O0

void __thiscall Imaginer::Utils::iRpn::Parser(iRpn *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  RPNnode *pRVar4;
  ostream *poVar5;
  double dVar6;
  double __y;
  RPNnode local_d8;
  RPNnode local_c8;
  RPNnode local_b8;
  RPNnode local_a8;
  RPNnode local_98;
  RPNnode local_88;
  char local_75;
  int local_74;
  undefined1 local_70 [4];
  int i;
  RPNnode roperand;
  RPNnode loperand;
  undefined1 local_48 [7];
  char op;
  RPNnode curnode;
  int local_24;
  int size;
  iStack<Imaginer::Utils::iRpn::RPNnode> result;
  iRpn *this_local;
  
  local_24 = 0x400;
  result._8_8_ = this;
  iStack<Imaginer::Utils::iRpn::RPNnode>::iStack
            ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,&local_24);
  iVar2 = iStack<Imaginer::Utils::iRpn::RPNnode>::size(this->_operands);
  RPNnode::RPNnode((RPNnode *)local_48);
  loperand._15_1_ = 0;
  RPNnode::RPNnode((RPNnode *)&roperand._is);
  RPNnode::RPNnode((RPNnode *)local_70);
  local_74 = 0;
  do {
    if (iVar2 < local_74) {
LAB_0010b0c3:
      poVar5 = operator<<((ostream *)&std::cout,(iStack<Imaginer::Utils::iRpn::RPNnode> *)&size);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iStack<Imaginer::Utils::iRpn::RPNnode>::~iStack
                ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size);
      return;
    }
    pRVar4 = iStack<Imaginer::Utils::iRpn::RPNnode>::operator[](this->_operands,local_74);
    RPNnode::operator=((RPNnode *)local_48,pRVar4);
    bVar1 = RPNnode::operator_cast_to_bool((RPNnode *)local_48);
    if (bVar1) {
      iStack<Imaginer::Utils::iRpn::RPNnode>::push
                ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,(RPNnode *)local_48);
    }
    else {
      local_75 = RPNnode::operator_cast_to_char((RPNnode *)local_48);
      bVar1 = isVariable(this,&local_75);
      if (bVar1) {
        iStack<Imaginer::Utils::iRpn::RPNnode>::push
                  ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,(RPNnode *)local_48);
        poVar5 = std::operator<<((ostream *)&std::cout,"unknowns nunber ");
        poVar5 = operator<<(poVar5,(RPNnode *)local_48);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        loperand._15_1_ = RPNnode::operator_cast_to_char((RPNnode *)local_48);
        if ((char)loperand._15_1_ < '\0') {
          bVar1 = isFun(this,&loperand.field_0xf);
          if (!bVar1) {
            poVar5 = std::operator<<((ostream *)&std::cout,"no sunch Function: ");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            goto LAB_0010b0c3;
          }
          poVar5 = std::operator<<((ostream *)&std::cout,"Function: ");
          poVar5 = std::operator<<(poVar5,(string *)((long)(char)loperand._15_1_ * 0x20 + 0x1125f0))
          ;
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        bVar1 = iStack<Imaginer::Utils::iRpn::RPNnode>::empty
                          ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size);
        if ((!bVar1) &&
           (iVar3 = iStack<Imaginer::Utils::iRpn::RPNnode>::size
                              ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size), 0 < iVar3)) {
          pRVar4 = iStack<Imaginer::Utils::iRpn::RPNnode>::operator[]
                             ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,-1);
          RPNnode::operator=((RPNnode *)&roperand._is,pRVar4);
          pRVar4 = iStack<Imaginer::Utils::iRpn::RPNnode>::operator[]
                             ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,-2);
          RPNnode::operator=((RPNnode *)local_70,pRVar4);
          bVar1 = RPNnode::operator_cast_to_bool((RPNnode *)&roperand._is);
          if (bVar1) {
            bVar1 = RPNnode::operator_cast_to_bool((RPNnode *)local_70);
            if (bVar1) {
              switch(loperand._15_1_) {
              case (BADTYPE)0x2a:
                dVar6 = RPNnode::operator*((RPNnode *)local_70,(RPNnode *)&roperand._is);
                RPNnode::RPNnode(&local_b8,dVar6);
                iStack<Imaginer::Utils::iRpn::RPNnode>::push
                          ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,&local_b8);
                break;
              case (BADTYPE)0x2b:
                dVar6 = RPNnode::operator+((RPNnode *)local_70,(RPNnode *)&roperand._is);
                RPNnode::RPNnode(&local_98,dVar6);
                iStack<Imaginer::Utils::iRpn::RPNnode>::push
                          ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,&local_98);
                break;
              default:
                poVar5 = std::operator<<((ostream *)&std::cout,"invalid operator");
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                break;
              case (BADTYPE)0x2d:
                dVar6 = RPNnode::operator-((RPNnode *)local_70,(RPNnode *)&roperand._is);
                RPNnode::RPNnode(&local_a8,dVar6);
                iStack<Imaginer::Utils::iRpn::RPNnode>::push
                          ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,&local_a8);
                break;
              case (BADTYPE)0x2f:
                dVar6 = RPNnode::operator/((RPNnode *)local_70,(RPNnode *)&roperand._is);
                RPNnode::RPNnode(&local_c8,dVar6);
                iStack<Imaginer::Utils::iRpn::RPNnode>::push
                          ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,&local_c8);
                break;
              case (BADTYPE)0x5e:
                dVar6 = RPNnode::operator_cast_to_double((RPNnode *)local_70);
                __y = RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
                dVar6 = pow(dVar6,__y);
                RPNnode::RPNnode(&local_d8,dVar6);
                iStack<Imaginer::Utils::iRpn::RPNnode>::push
                          ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,&local_d8);
                break;
              case (BADTYPE)0x5f:
                iStack<Imaginer::Utils::iRpn::RPNnode>::push
                          ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,(RPNnode *)local_70);
                dVar6 = RPNnode::operator-((RPNnode *)&roperand._is);
                RPNnode::RPNnode(&local_88,dVar6);
                iStack<Imaginer::Utils::iRpn::RPNnode>::push
                          ((iStack<Imaginer::Utils::iRpn::RPNnode> *)&size,&local_88);
              }
            }
            else {
              poVar5 = std::operator<<((ostream *)&std::cout,"R cannot calculate");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cout,"L cannot calculate");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

void iRpn::Parser()
{
    //genRpn();
    //_operands->reverse();
    iStack<RPNnode> result;
    int size = _operands->size();
    RPNnode curnode;
    char op = '\0';
    RPNnode  loperand;
    RPNnode  roperand;
    for(int i = 0;i <= size;++i)
    {
        curnode = (*_operands)[i];
        //std::cout << curnode << "\n";
        if(!curnode)//opearator
        {
            if(isVariable(curnode))
            {
                result.push(curnode);
                std::cout << "unknowns nunber " << curnode << std::endl;
            }
            else
            {
                op = curnode;
                if(op < 0)
                {
                    if(isFun(op))
                        std::cout << "Function: " << _sysfunS[op+128] << std::endl;
                    else
                    {
                        std::cout << "no sunch Function: " << std::endl;
                        break;
                    }
                }
                if(result.empty() || result.size() < 1)
                {
                    continue;
                }
                loperand = result[-1];
                roperand = result[-2];
                if(!loperand)
                {
                    std::cout << "L cannot calculate" << std::endl;
                    continue;
                }
                if(!roperand)
                {
                    std::cout << "R cannot calculate" << std::endl;
                    continue;
                }
                switch (op)
                {
                case '_':
                    result.push(roperand);
                    result.push(-loperand);
                    break;
                case '+':
                    result.push(roperand+loperand);
                    break;
                case '-':
                    result.push(roperand-loperand);
                    break;
                case '*':
                    result.push(roperand*loperand);
                    break;
                case '/':
                    result.push(roperand/loperand);
                    break;
                case '^':
                    result.push(pow(roperand,loperand));
                    break;
                default:
                    std::cout << "invalid operator" << std::endl;
                    break;
                }
            }
        }
        else//operand
        {
            result.push(curnode);
            //std::cout << curnode << "\n";
        }
    }
    std::cout << result << std::endl;
}